

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  JSContext *ctx_00;
  JSContext *ctx_01;
  JSRuntime *unaff_retaddr;
  JSContext *ctx;
  JSRuntime *rt;
  undefined4 in_stack_00000024;
  uint8_t *in_stack_00000028;
  JSContext *in_stack_00000030;
  char **in_stack_000000a0;
  int in_stack_000000ac;
  JSContext *in_stack_000000b0;
  JSRuntime *in_stack_ffffffffffffffd8;
  
  ctx_00 = (JSContext *)JS_NewRuntime();
  js_std_init_handlers(unaff_retaddr);
  ctx_01 = JS_NewContext(in_stack_ffffffffffffffd8);
  js_std_add_helpers(in_stack_000000b0,in_stack_000000ac,in_stack_000000a0);
  js_init_module_std(ctx_00,(char *)ctx_01);
  js_init_module_os(ctx_00,(char *)ctx_01);
  js_std_eval_binary(in_stack_00000030,in_stack_00000028,CONCAT44(in_stack_00000024,argc),argv._4_4_
                    );
  js_std_eval_binary(in_stack_00000030,in_stack_00000028,CONCAT44(in_stack_00000024,argc),argv._4_4_
                    );
  js_std_loop(ctx_01);
  JS_FreeContext(ctx_01);
  JS_FreeRuntime((JSRuntime *)CONCAT44(in_stack_00000024,argc));
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    JSRuntime *rt;
    JSContext *ctx;

    rt = JS_NewRuntime();
    js_std_init_handlers(rt);

    ctx = JS_NewContext(rt);
    js_std_add_helpers(ctx, argc, argv);
    js_init_module_std(ctx, "std");
    js_init_module_os(ctx, "os");

    js_std_eval_binary(ctx, nunjucks, nunjucks_size, 0);
    js_std_eval_binary(ctx, mainjs, mainjs_size, 0);

    js_std_loop(ctx);

    JS_FreeContext(ctx);
    JS_FreeRuntime(rt);

  return 0;
}